

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

int __thiscall QString::remove(QString *this,char *__filename)

{
  QVLAStorage<2UL,_2UL,_256LL> *array;
  char16_t *pcVar1;
  CaseSensitivity in_EDX;
  ulong uVar2;
  char16_t *__value;
  long in_FS_OFFSET;
  QStringView local_268;
  back_insert_iterator<QVarLengthArray<char16_t,_256LL>_> local_258;
  QVarLengthArray<char16_t,_256LL> local_250;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __value = *(char16_t **)(__filename + 8);
  pcVar1 = (this->d).ptr;
  if ((__value < pcVar1) || (pcVar1 + (this->d).size <= __value)) {
    local_250.super_QVLABase<char16_t>.super_QVLABaseBase.a = *(qsizetype *)(__filename + 0x10);
    local_250.super_QVLABase<char16_t>.super_QVLABaseBase.s = (qsizetype)__value;
    removeStringImpl<QStringView>(this,(QStringView *)&local_250,in_EDX);
    goto LAB_0032579a;
  }
  uVar2 = *(ulong *)(__filename + 0x10);
  array = &local_250.super_QVLAStorage<2UL,_2UL,_256LL>;
  local_250.super_QVLABase<char16_t>.super_QVLABaseBase.a = 0x100;
  local_250.super_QVLABase<char16_t>.super_QVLABaseBase.s = 0;
  local_250.super_QVLABase<char16_t>.super_QVLABaseBase.ptr = array;
  if (uVar2 < 0x101) {
    local_258.container = &local_250;
    if (uVar2 != 0) goto LAB_00325745;
  }
  else {
    QVLABase<char16_t>::reallocate_impl(&local_250.super_QVLABase<char16_t>,0x100,array,0,uVar2);
LAB_00325745:
    local_258.container = &local_250;
    uVar2 = uVar2 + 1;
    do {
      std::back_insert_iterator<QVarLengthArray<char16_t,_256LL>_>::operator=(&local_258,__value);
      __value = __value + 1;
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
  }
  local_268.m_size = local_250.super_QVLABase<char16_t>.super_QVLABaseBase.s;
  local_268.m_data =
       (storage_type_conflict *)local_250.super_QVLABase<char16_t>.super_QVLABaseBase.ptr;
  removeStringImpl<QStringView>(this,&local_268,in_EDX);
  if ((QVLAStorage<2UL,_2UL,_256LL> *)local_250.super_QVLABase<char16_t>.super_QVLABaseBase.ptr !=
      array) {
    QtPrivate::sizedFree
              (local_250.super_QVLABase<char16_t>.super_QVLABaseBase.ptr,
               local_250.super_QVLABase<char16_t>.super_QVLABaseBase.a * 2);
  }
LAB_0032579a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (int)this;
}

Assistant:

QString &QString::remove(const QString &str, Qt::CaseSensitivity cs)
{
    const auto s = str.d.data();
    if (QtPrivate::q_points_into_range(s, d))
        removeStringImpl(*this, QStringView{QVarLengthArray(s, s + str.size())}, cs);
    else
        removeStringImpl(*this, qToStringViewIgnoringNull(str), cs);
    return *this;
}